

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O3

void Fxch_SCHashTableDelete(Fxch_SCHashTable_t *pSCHashTable)

{
  int *piVar1;
  Fxch_SCHashTable_Entry_t *pFVar2;
  uint uVar3;
  
  pFVar2 = pSCHashTable->pBins;
  uVar3 = 0;
  do {
    if (pFVar2[uVar3].vSCData != (Fxch_SubCube_t *)0x0) {
      free(pFVar2[uVar3].vSCData);
      pFVar2 = pSCHashTable->pBins;
      pFVar2[uVar3].vSCData = (Fxch_SubCube_t *)0x0;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 <= pSCHashTable->SizeMask);
  piVar1 = (pSCHashTable->vSubCube0).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (pSCHashTable->vSubCube0).pArray = (int *)0x0;
  }
  (pSCHashTable->vSubCube0).nCap = 0;
  (pSCHashTable->vSubCube0).nSize = 0;
  piVar1 = (pSCHashTable->vSubCube1).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (pSCHashTable->vSubCube1).pArray = (int *)0x0;
  }
  (pSCHashTable->vSubCube1).nCap = 0;
  (pSCHashTable->vSubCube1).nSize = 0;
  if (pSCHashTable->pBins != (Fxch_SCHashTable_Entry_t *)0x0) {
    free(pSCHashTable->pBins);
  }
  free(pSCHashTable);
  return;
}

Assistant:

void Fxch_SCHashTableDelete( Fxch_SCHashTable_t* pSCHashTable )
{
    unsigned i;
    for ( i = 0; i <= pSCHashTable->SizeMask; i++ )
        ABC_FREE( pSCHashTable->pBins[i].vSCData );
    Vec_IntErase( &pSCHashTable->vSubCube0 );
    Vec_IntErase( &pSCHashTable->vSubCube1 );
    ABC_FREE( pSCHashTable->pBins );
    ABC_FREE( pSCHashTable );
}